

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_score.cc
# Opt level: O0

void __thiscall
xLearn::FMScore::CalcGrad(FMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  int iVar1;
  ostream *poVar2;
  long in_RDI;
  LogSeverity in_XMM0_Da;
  real_t in_stack_00000280;
  real_t in_stack_00000284;
  Model *in_stack_00000288;
  SparseRow *in_stack_00000290;
  FMScore *in_stack_00000298;
  real_t in_stack_00000310;
  real_t in_stack_00000314;
  Model *in_stack_00000318;
  SparseRow *in_stack_00000320;
  FMScore *in_stack_00000328;
  real_t in_stack_00000400;
  real_t in_stack_00000404;
  Model *in_stack_00000408;
  SparseRow *in_stack_00000410;
  FMScore *in_stack_00000418;
  allocator *this_00;
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [16];
  string *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  string *in_stack_ffffffffffffffd8;
  
  iVar1 = std::__cxx11::string::compare((char *)(in_RDI + 0x20));
  if (iVar1 == 0) {
    calc_grad_sgd(in_stack_00000298,in_stack_00000290,in_stack_00000288,in_stack_00000284,
                  in_stack_00000280);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)(in_RDI + 0x20));
    if (iVar1 == 0) {
      calc_grad_adagrad(in_stack_00000328,in_stack_00000320,in_stack_00000318,in_stack_00000314,
                        in_stack_00000310);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)(in_RDI + 0x20));
      if (iVar1 == 0) {
        calc_grad_ftrl(in_stack_00000418,in_stack_00000410,in_stack_00000408,in_stack_00000404,
                       in_stack_00000400);
      }
      else {
        Logger::Logger((Logger *)&stack0xffffffffffffffdc,FATAL);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_48,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/score/fm_score.cc"
                   ,&local_49);
        this_00 = &local_81;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_80,"CalcGrad",this_00);
        poVar2 = Logger::Start(in_XMM0_Da,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                               in_stack_ffffffffffffffc8);
        poVar2 = std::operator<<(poVar2,"Unknow optimization method: ");
        std::operator<<(poVar2,(string *)(in_RDI + 0x20));
        std::__cxx11::string::~string(local_80);
        std::allocator<char>::~allocator((allocator<char> *)&local_81);
        std::__cxx11::string::~string(local_48);
        std::allocator<char>::~allocator((allocator<char> *)&local_49);
        Logger::~Logger((Logger *)this_00);
      }
    }
  }
  return;
}

Assistant:

void FMScore::CalcGrad(const SparseRow* row,
                       Model& model,
                       real_t pg,
                       real_t norm) {
  // Using sgd
  if (opt_type_.compare("sgd") == 0) {
    this->calc_grad_sgd(row, model, pg, norm);
  }
  // Using adagrad
  else if (opt_type_.compare("adagrad") == 0) {
    this->calc_grad_adagrad(row, model, pg, norm);
  }
  // Using ftrl 
  else if (opt_type_.compare("ftrl") == 0) {
    this->calc_grad_ftrl(row, model, pg, norm);
  }
  else {
    LOG(FATAL) << "Unknow optimization method: " << opt_type_;
  }
}